

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setPositivePrefix(DecimalFormat *this,UnicodeString *newValue)

{
  UBool UVar1;
  DecimalFormatProperties *pDVar2;
  UnicodeString *newValue_local;
  DecimalFormat *this_local;
  
  pDVar2 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  UVar1 = UnicodeString::operator==(newValue,&pDVar2->positivePrefix);
  if (UVar1 == '\0') {
    pDVar2 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    UnicodeString::operator=(&pDVar2->positivePrefix,newValue);
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setPositivePrefix(const UnicodeString& newValue) {
    if (newValue == fields->properties->positivePrefix) { return; }
    fields->properties->positivePrefix = newValue;
    touchNoError();
}